

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_bsend_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *dest,
                  MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  MPIABI_Fint *comm_local;
  MPIABI_Fint *tag_local;
  MPIABI_Fint *dest_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *count_local;
  void *buf_local;
  
  mpi_bsend_(buf,count,datatype,dest,tag,comm,ierror);
  return;
}

Assistant:

void mpiabi_bsend_(
  const void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * dest,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_bsend_(
    buf,
    count,
    datatype,
    dest,
    tag,
    comm,
    ierror
  );
}